

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_ref.hpp
# Opt level: O2

value_type __thiscall
nlohmann::json_abi_v3_11_2::detail::
json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::moved_or_copied(json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *this)

{
  json_value in_RDX;
  json_value extraout_RDX;
  value_t *in_RSI;
  value_type vVar1;
  
  if (*(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        **)(in_RSI + 0x10) ==
      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       *)0x0) {
    (this->owned_value).m_type = *in_RSI;
    (this->owned_value).m_value = *(json_value *)(in_RSI + 8);
    *in_RSI = null;
    in_RSI[8] = null;
    in_RSI[9] = null;
    in_RSI[10] = null;
    in_RSI[0xb] = null;
    in_RSI[0xc] = null;
    in_RSI[0xd] = null;
    in_RSI[0xe] = null;
    in_RSI[0xf] = null;
  }
  else {
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&this->owned_value,
                 *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   **)(in_RSI + 0x10));
    in_RDX = extraout_RDX;
  }
  vVar1.m_value.object = in_RDX.object;
  vVar1._0_8_ = this;
  return vVar1;
}

Assistant:

value_type moved_or_copied() const
    {
        if (value_ref == nullptr)
        {
            return std::move(owned_value);
        }
        return *value_ref;
    }